

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opt-parser.h
# Opt level: O0

char * ORPG::Core::program_name(char *str)

{
  char *pcVar1;
  char *local_18;
  char *ret;
  char *str_local;
  
  pcVar1 = strrchr(str,0x2f);
  local_18 = str;
  if (pcVar1 != (char *)0x0) {
    local_18 = pcVar1 + 1;
  }
  return local_18;
}

Assistant:

char* program_name(char* str) {
            char* ret;

            ret = strrchr(str, '/');
            if(ret)
                ret++;
            else
                ret = str;

            return ret;
        }